

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
PyreNet::Layer::calculate
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Layer *this,
          vector<double,_std::allocator<double>_> *input)

{
  pointer pPVar1;
  int *this_00;
  LayerThreadPool *this_01;
  iterator __begin1;
  pointer pPVar2;
  iterator __end1;
  vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *__range1;
  Perceptron *p_1;
  undefined1 local_60 [8];
  LayerQueueJob job;
  vector<double,_std::allocator<double>_> *ans;
  int track;
  
  job.track = (int *)__return_storage_ptr__;
  this_01 = LayerThreadPool::getInstance();
  pPVar2 = (this->nodes).
           super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->nodes).
           super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ans._4_4_ = (undefined4)(((long)pPVar1 - (long)pPVar2) / 0x28);
  for (; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    job.p = (Perceptron *)this->activation;
    job.activation = (Activation *)((long)&ans + 4);
    local_60 = (undefined1  [8])input;
    job.input = &pPVar2->weights;
    LayerThreadPool::addJob(this_01,(LayerQueueJob *)local_60);
  }
  LayerThreadPool::waitForTasks(this_01,(int *)((long)&ans + 4));
  this_00 = job.track;
  job.track[4] = 0;
  job.track[5] = 0;
  job.track[0] = 0;
  job.track[1] = 0;
  job.track[2] = 0;
  job.track[3] = 0;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)job.track,
             ((long)(this->nodes).
                    super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes).
                   super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x28);
  pPVar1 = (this->nodes).
           super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar2 = (this->nodes).
                super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
                _M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    local_60 = (undefined1  [8])Perceptron::getValue(pPVar2);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)this_00,(double *)local_60);
  }
  return (vector<double,_std::allocator<double>_> *)this_00;
}

Assistant:

std::vector<double> Layer::calculate(const std::vector<double> &input) {
        LayerThreadPool* layerThreadPool = LayerThreadPool::getInstance();
        int track = this->nodes.size();
        for (Perceptron &p : this->nodes) {
            LayerThreadPool::LayerQueueJob job(input, p, this->activation, track);
            layerThreadPool->addJob(job);
        }
        layerThreadPool->waitForTasks(track);
        std::vector<double> ans;
        ans.reserve(this->nodes.size());
        for (const Perceptron &p : this->nodes) {
            ans.push_back(p.getValue());
        }
        return ans;
    }